

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void pick_up_item(tgestate_t *state)

{
  item_t iVar1;
  attribute_t attrs;
  itemstruct_t *piVar2;
  byte bVar3;
  
  iVar1 = state->items_held[0];
  if ((iVar1 == 0xff) || (state->items_held[1] == 0xff)) {
    piVar2 = find_nearby_item(state);
    if (piVar2 != (itemstruct_t *)0x0) {
      *(byte *)((long)state->jmpbuf_main[0].__jmpbuf + (((ulong)(iVar1 == 0xff) ^ 0x6e5) - 0x20)) =
           piVar2->item_and_flags & 0x1f;
      if (state->room_index == '\0') {
        plot_all_tiles(state);
      }
      else {
        setup_room(state);
        plot_interior_tiles(state);
        attrs = choose_game_window_attributes(state);
        set_game_window_attributes(state,attrs);
      }
      if (-1 < (char)piVar2->item_and_flags) {
        piVar2->item_and_flags = piVar2->item_and_flags | 0x80;
        bVar3 = 0x6b;
        if (state->morale < 0x6b) {
          bVar3 = state->morale;
        }
        state->morale = bVar3 + 5;
        increase_score(state,'\x05');
      }
      piVar2->room_and_flags = '\0';
      (piVar2->isopos).x = '\0';
      (piVar2->isopos).y = '\0';
      draw_item(state,state->items_held[0],0x1087);
      draw_item(state,state->items_held[1],0x108a);
      play_speaker(state,sound_PICK_UP_ITEM);
      return;
    }
  }
  return;
}

Assistant:

void pick_up_item(tgestate_t *state)
{
  itemstruct_t *itemstr; /* was HL */
  item_t       *pitem;   /* was DE */
  item_t        item;    /* was A */
  attribute_t   attrs;   /* was A */

  assert(state != NULL);

  if (state->items_held[0] != item_NONE &&
      state->items_held[1] != item_NONE)
    return; /* No spare slots. */

  itemstr = find_nearby_item(state);
  if (itemstr == NULL)
    return; /* No item nearby. */

  /* Locate an empty item slot. */
  pitem = &state->items_held[0];
  item = *pitem;
  if (item != item_NONE)
    pitem++;
  *pitem = itemstr->item_and_flags & (itemstruct_ITEM_MASK | itemstruct_ITEM_FLAG_UNKNOWN); // I don't see this unknown flag used anywhere else in the code. Is it a real flag, or evidence that the items pool was originally larger (ie. up to 32 objects rather than 16).

  if (state->room_index == room_0_OUTDOORS)
  {
    /* Outdoors. */
    plot_all_tiles(state);
  }
  else
  {
    /* Indoors. */
    // FUTURE: replace with call to setup_room_and_plot
    setup_room(state);
    plot_interior_tiles(state);
    attrs = choose_game_window_attributes(state);
    set_game_window_attributes(state, attrs);
  }

  if ((itemstr->item_and_flags & itemstruct_ITEM_FLAG_HELD) == 0)
  {
    /* Have picked up an item not previously held. */
    itemstr->item_and_flags |= itemstruct_ITEM_FLAG_HELD;
    increase_morale_by_5_score_by_5(state);
  }

  itemstr->room_and_flags = 0;
  itemstr->isopos.x       = 0;
  itemstr->isopos.y       = 0;

  draw_all_items(state);
  play_speaker(state, sound_PICK_UP_ITEM);
}